

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_Material::Read(ON_Material *this,ON_BinaryArchive *archive)

{
  ON_BinaryArchive *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ON_Texture *object;
  uint local_40;
  ON__UINT32 local_3c;
  uint i;
  uint count;
  int iStack_30;
  bool textures_chunk_rc;
  int textures_minor_version;
  int textures_major_version;
  int minor_version;
  int major_version;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_Material *this_local;
  
  _major_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  operator=(this,&Unset);
  iVar2 = ON_BinaryArchive::Archive3dmVersion(_major_version);
  if (iVar2 < 0x3c) {
    this_local._7_1_ = Internal_ReadV5(this,_major_version);
  }
  else {
    uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_major_version);
    if (uVar3 < 0x8c005c76) {
      this_local._7_1_ = Internal_ReadV5(this,_major_version);
    }
    else {
      minor_version._3_1_ = 0;
      textures_major_version = 0;
      textures_minor_version = 0;
      bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                        (_major_version,0x40008000,&textures_major_version,&textures_minor_version);
      if (bVar1) {
        if (((((textures_major_version == 1) &&
              (bVar1 = ON_ModelComponent::ReadModelComponentAttributes
                                 (&this->super_ON_ModelComponent,_major_version), bVar1)) &&
             (bVar1 = ON_BinaryArchive::ReadUuid(_major_version,&this->m_plugin_id), bVar1)) &&
            (((bVar1 = ON_BinaryArchive::ReadColor(_major_version,&this->m_ambient), bVar1 &&
              (bVar1 = ON_BinaryArchive::ReadColor(_major_version,&this->m_diffuse), bVar1)) &&
             ((bVar1 = ON_BinaryArchive::ReadColor(_major_version,&this->m_emission), bVar1 &&
              ((bVar1 = ON_BinaryArchive::ReadColor(_major_version,&this->m_specular), bVar1 &&
               (bVar1 = ON_BinaryArchive::ReadColor(_major_version,&this->m_reflection), bVar1))))))
            )) && (bVar1 = ON_BinaryArchive::ReadColor(_major_version,&this->m_transparent), bVar1))
        {
          RemoveColorAlphaValues(this);
          bVar1 = ON_BinaryArchive::ReadDouble(_major_version,&this->m_index_of_refraction);
          if ((((bVar1) &&
               (bVar1 = ON_BinaryArchive::ReadDouble(_major_version,&this->m_reflectivity), bVar1))
              && (bVar1 = ON_BinaryArchive::ReadDouble(_major_version,&this->m_shine), bVar1)) &&
             (bVar1 = ON_BinaryArchive::ReadDouble(_major_version,&this->m_transparency), bVar1)) {
            iStack_30 = 0;
            count = 0;
            bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                              (_major_version,0x40008000,&stack0xffffffffffffffd0,(int *)&count);
            if (bVar1) {
              i._3_1_ = 0;
              if (iStack_30 == 1) {
                local_3c = 0;
                bVar1 = ON_BinaryArchive::ReadInt(_major_version,&local_3c);
                if (bVar1) {
                  ON_ClassArray<ON_Texture>::SetCount
                            (&(this->m_textures).super_ON_ClassArray<ON_Texture>,0);
                  ON_ClassArray<ON_Texture>::Reserve
                            (&(this->m_textures).super_ON_ClassArray<ON_Texture>,(ulong)local_3c);
                  for (local_40 = 0; this_00 = _major_version, local_40 < local_3c;
                      local_40 = local_40 + 1) {
                    object = ON_ClassArray<ON_Texture>::AppendNew
                                       (&(this->m_textures).super_ON_ClassArray<ON_Texture>);
                    iVar2 = ON_BinaryArchive::ReadObject(this_00,&object->super_ON_Object);
                    if (iVar2 == 0) break;
                  }
                  if (local_3c <= local_40) {
                    i._3_1_ = 1;
                  }
                }
              }
              bVar1 = ON_BinaryArchive::EndRead3dmChunk(_major_version);
              if (!bVar1) {
                i._3_1_ = 0;
              }
              if (((((i._3_1_ & 1) != 0) &&
                   (bVar1 = ON_BinaryArchive::ReadArray(_major_version,&this->m_material_channel),
                   bVar1)) &&
                  (((bVar1 = ON_BinaryArchive::ReadBool(_major_version,&this->m_bShareable), bVar1
                    && ((bVar1 = ON_BinaryArchive::ReadBool
                                           (_major_version,&this->m_bDisableLighting), bVar1 &&
                        (bVar1 = ON_BinaryArchive::ReadBool
                                           (_major_version,&this->m_bFresnelReflections), bVar1))))
                   && (bVar1 = ON_BinaryArchive::ReadDouble
                                         (_major_version,&this->m_reflection_glossiness), bVar1))))
                 && ((((bVar1 = ON_BinaryArchive::ReadDouble
                                          (_major_version,&this->m_refraction_glossiness), bVar1 &&
                       (bVar1 = ON_BinaryArchive::ReadDouble
                                          (_major_version,&this->m_fresnel_index_of_refraction),
                       bVar1)) &&
                      (bVar1 = ON_BinaryArchive::ReadUuid
                                         (_major_version,&this->m_rdk_material_instance_id), bVar1))
                     && (bVar1 = ON_BinaryArchive::ReadBool
                                           (_major_version,
                                            &this->
                                             m_bUseDiffuseTextureAlphaForObjectTransparencyTexture),
                        bVar1)))) {
                minor_version._3_1_ = 1;
              }
            }
          }
        }
        bVar1 = ON_BinaryArchive::EndRead3dmChunk(_major_version);
        if (!bVar1) {
          minor_version._3_1_ = 0;
        }
        this_local._7_1_ = (bool)(minor_version._3_1_ & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Material::Read( ON_BinaryArchive& archive )
{
  *this = ON_Material::Unset;

  if (archive.Archive3dmVersion() < 60)
    return Internal_ReadV5(archive);
  if (archive.ArchiveOpenNURBSVersion() <  2348833910)
    return Internal_ReadV5(archive);

  bool rc = false;
  int major_version = 0;
  int minor_version = 0;
  if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version))
    return false;
  for (;;)
  {
    if (1 != major_version)
      break;

    if ( !ReadModelComponentAttributes(archive)) break;

    if ( !archive.ReadUuid(m_plugin_id) ) break;

    if ( !archive.ReadColor( m_ambient ) ) break;
    if ( !archive.ReadColor( m_diffuse ) ) break;
    if ( !archive.ReadColor( m_emission ) ) break;
    if ( !archive.ReadColor( m_specular ) ) break;
    if ( !archive.ReadColor( m_reflection ) ) break;
    if ( !archive.ReadColor( m_transparent ) ) break;

    //https://mcneel.myjetbrains.com/youtrack/issue/RH-85216/ONMaterial-diffuse-color-is-ONColorUnsetColor
    RemoveColorAlphaValues();

    if ( !archive.ReadDouble( &m_index_of_refraction ) ) break;
    if ( !archive.ReadDouble( &m_reflectivity ) ) break;
    if ( !archive.ReadDouble( &m_shine ) ) break;
    if (!archive.ReadDouble(&m_transparency)) break;

    // array of textures read in a way that user data persists
    {
      int textures_major_version = 0;
      int textures_minor_version = 0;
      if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK, &textures_major_version, &textures_minor_version))
        break;
      bool textures_chunk_rc = false;
      for (;;)
      {
        if (1 != textures_major_version)
          break;

        unsigned int count = 0;
        if ( !archive.ReadInt(&count) )
          break;
        m_textures.SetCount(0);
        m_textures.Reserve(count);
        unsigned int i;
        for (i = 0; i < count; i++)
        {
          if (!archive.ReadObject(m_textures.AppendNew()))
            break;
        }
        if (i < count)
          break;
        textures_chunk_rc = true;
        break;
      }
      if (!archive.EndRead3dmChunk())
        textures_chunk_rc = false;
      if (!textures_chunk_rc)
        break;
    }

    if ( !archive.ReadArray(m_material_channel) )
      break;
    if ( !archive.ReadBool(&m_bShareable) )
      break;
    if ( !archive.ReadBool(&m_bDisableLighting))
      break;
    if ( !archive.ReadBool(&m_bFresnelReflections))
      break;
    if ( !archive.ReadDouble(&m_reflection_glossiness))
      break;
    if ( !archive.ReadDouble(&m_refraction_glossiness))
      break;
    if ( !archive.ReadDouble(&m_fresnel_index_of_refraction))
      break;
    if ( !archive.ReadUuid(m_rdk_material_instance_id))
      break;
    if ( !archive.ReadBool(&m_bUseDiffuseTextureAlphaForObjectTransparencyTexture))
      break;

    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}